

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O3

void __thiscall
duckdb::UngroupedDistinctAggregateFinalizeEvent::Schedule
          (UngroupedDistinctAggregateFinalizeEvent *this)

{
  size_type __n;
  Executor *executor;
  UngroupedAggregateGlobalSinkState *state_p;
  int32_t val;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  const_reference this_00;
  pointer this_01;
  const_iterator cVar2;
  reference this_02;
  ClientContext *context;
  pointer pDVar3;
  reference this_03;
  type sink_p;
  idx_t iVar4;
  TaskScheduler *this_04;
  unsigned_long uVar5;
  Pipeline *pPVar6;
  UngroupedDistinctAggregateFinalizeTask *this_05;
  long lVar7;
  ulong uVar8;
  enable_shared_from_this<duckdb::Task> *object;
  PhysicalUngroupedAggregate *pPVar9;
  element_type *this_06;
  UngroupedDistinctAggregateFinalizeEvent *this_07;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> tasks;
  _Head_base<0UL,_duckdb::UngroupedDistinctAggregateFinalizeTask_*,_false> local_d0;
  undefined1 local_c8 [40];
  pointer pVStack_a0;
  pointer local_98;
  UngroupedDistinctAggregateFinalizeEvent *local_90;
  enable_shared_from_this<duckdb::Event> local_88;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  PhysicalUngroupedAggregate *local_60;
  Task *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  local_48;
  
  pPVar9 = this->op;
  _Var1._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                ::operator*(&pPVar9->distinct_data);
  local_c8._32_8_ = (GroupedAggregateData *)0x0;
  local_90 = this;
  if ((pPVar9->aggregates).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pPVar9->aggregates).
      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar7 = 0;
  }
  else {
    this_06 = (element_type *)&pPVar9->aggregates;
    local_98 = (pointer)&((type)_Var1._M_pi)->radix_tables;
    local_c8._24_8_ = &this->global_source_states;
    lVar7 = 0;
    local_70 = this_06;
    local_68._M_pi = _Var1._M_pi;
    local_60 = pPVar9;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                              *)this_06,local_c8._32_8_);
      this_01 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(this_00);
      BaseExpression::Cast<duckdb::BoundAggregateExpression>(&this_01->super_BaseExpression);
      local_c8._0_8_ = local_c8._32_8_;
      if (((((type)_Var1._M_pi)->radix_tables).
           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (((type)_Var1._M_pi)->radix_tables).
           super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) ||
         (cVar2 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(((type)_Var1._M_pi)->info->table_map)._M_h,(key_type *)local_c8),
         cVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
         _M_cur == (__node_type *)0x0)) {
        local_c8._0_8_ = (GroupedAggregateData *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
                    *)local_c8._24_8_,
                   (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                    *)local_c8);
        if ((GroupedAggregateData *)local_c8._0_8_ != (GroupedAggregateData *)0x0) {
          (**(code **)(*(long *)&((_Rep_type *)local_c8._0_8_)->_M_impl + 8))();
        }
      }
      else {
        cVar2 = ::std::
                _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(((type)_Var1._M_pi)->info->table_map)._M_h,(key_type *)(local_c8 + 0x20));
        if (cVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
            _M_cur == (__node_type *)0x0) {
          ::std::__throw_out_of_range("_Map_base::at");
        }
        __n = *(size_type *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                      ._M_cur + 0x10);
        this_02 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                                *)local_98,__n);
        context = (ClientContext *)
                  unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                  ::operator*(this_02);
        pDVar3 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                 ::operator->(&this->gstate->distinct_state);
        this_03 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                  ::operator[](&pDVar3->radix_states,__n);
        sink_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                 ::operator*(this_03);
        iVar4 = RadixPartitionedHashTable::MaxThreads((RadixPartitionedHashTable *)context,sink_p);
        RadixPartitionedHashTable::GetGlobalSourceState
                  ((RadixPartitionedHashTable *)local_c8,context);
        ::std::
        vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>,std::allocator<duckdb::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>>>
                    *)local_c8._24_8_,
                   (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                    *)local_c8);
        this_06 = local_70;
        if ((GroupedAggregateData *)local_c8._0_8_ != (GroupedAggregateData *)0x0) {
          (**(code **)(*(long *)&((_Rep_type *)local_c8._0_8_)->_M_impl + 8))();
        }
        lVar7 = lVar7 + iVar4;
        _Var1._M_pi = local_68._M_pi;
        pPVar9 = local_60;
      }
      local_c8._32_8_ = &(((_Rep_type *)local_c8._32_8_)->_M_impl).field_0x0 + 1;
    } while ((ulong)local_c8._32_8_ <
             (undefined1 *)
             ((long)(pPVar9->aggregates).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pPVar9->aggregates).
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  this_07 = local_90;
  uVar8 = lVar7 + (ulong)(lVar7 == 0);
  this_04 = TaskScheduler::GetScheduler(local_90->context);
  val = TaskScheduler::NumberOfThreads(this_04);
  uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
  if (uVar5 <= uVar8) {
    uVar8 = uVar5;
  }
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_48.
  super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_c8._0_8_ = (GroupingSet *)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_8_ = (pointer)0x0;
  if (uVar5 == 0) {
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_c8._24_8_ = &(this_07->super_BasePipelineEvent).pipeline;
    local_98 = (pointer)&(this_07->super_BasePipelineEvent).super_Event.
                         super_enable_shared_from_this<duckdb::Event>;
    do {
      pPVar6 = shared_ptr<duckdb::Pipeline,_true>::operator->
                         ((shared_ptr<duckdb::Pipeline,_true> *)local_c8._24_8_);
      executor = pPVar6->executor;
      enable_shared_from_this<duckdb::Event>::shared_from_this(&local_88);
      pPVar9 = this_07->op;
      state_p = this_07->gstate;
      this_05 = (UngroupedDistinctAggregateFinalizeTask *)operator_new(0xd8);
      local_c8._32_8_ =
           local_88.__weak_this_.internal.
           super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pVStack_a0 = (pointer)local_88.__weak_this_.internal.
                            super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi;
      local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_88.__weak_this_.internal.super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      UngroupedDistinctAggregateFinalizeTask::UngroupedDistinctAggregateFinalizeTask
                (this_05,executor,(shared_ptr<duckdb::Event,_true> *)(local_c8 + 0x20),pPVar9,
                 state_p);
      this_07 = local_90;
      local_d0._M_head_impl = this_05;
      if (pVStack_a0 != (pointer)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVStack_a0);
      }
      ::std::__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<duckdb::UngroupedDistinctAggregateFinalizeTask,std::default_delete<duckdb::UngroupedDistinctAggregateFinalizeTask>,void>
                ((__shared_ptr<duckdb::Task,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (unique_ptr<duckdb::UngroupedDistinctAggregateFinalizeTask,_std::default_delete<duckdb::UngroupedDistinctAggregateFinalizeTask>_>
                  *)&local_d0);
      object = &local_58->super_enable_shared_from_this<duckdb::Task>;
      if (local_58 == (Task *)0x0) {
        object = (enable_shared_from_this<duckdb::Task> *)0x0;
      }
      shared_ptr<duckdb::Task,_true>::__enable_weak_this<duckdb::Task,_duckdb::Task,_0>
                ((shared_ptr<duckdb::Task,_true> *)&local_58,object,local_58);
      ::std::
      vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
      ::emplace_back<duckdb::shared_ptr<duckdb::Task,true>>
                ((vector<duckdb::shared_ptr<duckdb::Task,true>,std::allocator<duckdb::shared_ptr<duckdb::Task,true>>>
                  *)local_c8,(shared_ptr<duckdb::Task,_true> *)&local_58);
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      if (local_d0._M_head_impl != (UngroupedDistinctAggregateFinalizeTask *)0x0) {
        (*((local_d0._M_head_impl)->super_ExecutorTask).super_Task._vptr_Task[1])();
      }
      local_d0._M_head_impl = (UngroupedDistinctAggregateFinalizeTask *)0x0;
      if ((pointer)local_88.__weak_this_.internal.
                   super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (pointer)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.__weak_this_.internal.
                   super___weak_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      this_07->tasks_scheduled = this_07->tasks_scheduled + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_c8._16_8_;
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_c8._0_4_;
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ = local_c8._4_4_;
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ = local_c8._8_4_;
    local_48.
    super__Vector_base<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ = local_c8._12_4_;
  }
  local_c8._0_8_ = (GroupingSet *)0x0;
  local_c8._8_8_ = (pointer)0x0;
  local_c8._16_8_ = (pointer)0x0;
  Event::SetTasks((Event *)this_07,(vector<duckdb::shared_ptr<duckdb::Task,_true>,_true> *)&local_48
                 );
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector(&local_48);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
  ::~vector((vector<duckdb::shared_ptr<duckdb::Task,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Task,_true>_>_>
             *)local_c8);
  return;
}

Assistant:

void UngroupedDistinctAggregateFinalizeEvent::Schedule() {
	D_ASSERT(gstate.distinct_state);
	auto &aggregates = op.aggregates;
	auto &distinct_data = *op.distinct_data;

	idx_t n_tasks = 0;
	idx_t payload_idx = 0;
	idx_t next_payload_idx = 0;
	for (idx_t agg_idx = 0; agg_idx < aggregates.size(); agg_idx++) {
		auto &aggregate = aggregates[agg_idx]->Cast<BoundAggregateExpression>();

		// Forward the payload idx
		payload_idx = next_payload_idx;
		next_payload_idx = payload_idx + aggregate.children.size();

		// If aggregate is not distinct, skip it
		if (!distinct_data.IsDistinct(agg_idx)) {
			global_source_states.push_back(nullptr);
			continue;
		}
		D_ASSERT(distinct_data.info.table_map.count(agg_idx));

		// Create global state for scanning
		auto table_idx = distinct_data.info.table_map.at(agg_idx);
		auto &radix_table_p = *distinct_data.radix_tables[table_idx];
		n_tasks += radix_table_p.MaxThreads(*gstate.distinct_state->radix_states[table_idx]);
		global_source_states.push_back(radix_table_p.GetGlobalSourceState(context));
	}
	n_tasks = MaxValue<idx_t>(n_tasks, 1);
	n_tasks = MinValue<idx_t>(n_tasks, NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads()));

	vector<shared_ptr<Task>> tasks;
	for (idx_t i = 0; i < n_tasks; i++) {
		tasks.push_back(
		    make_uniq<UngroupedDistinctAggregateFinalizeTask>(pipeline->executor, shared_from_this(), op, gstate));
		tasks_scheduled++;
	}
	SetTasks(std::move(tasks));
}